

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopMan.c
# Opt level: O2

void Hop_ManPrintStats(Hop_Man_t *p)

{
  uint uVar1;
  
  printf("PI/PO = %d/%d. ",(ulong)(uint)p->nObjs[2],(ulong)(uint)p->nObjs[3]);
  printf("A = %7d. ",(ulong)(uint)p->nObjs[4]);
  printf("X = %5d. ",(ulong)(uint)p->nObjs[5]);
  printf("Cre = %7d. ",(ulong)(uint)p->nCreated);
  printf("Del = %7d. ",(ulong)(uint)p->nDeleted);
  uVar1 = Hop_ManCountLevels(p);
  printf("Lev = %3d. ",(ulong)uVar1);
  putchar(10);
  return;
}

Assistant:

void Hop_ManPrintStats( Hop_Man_t * p )
{
    printf( "PI/PO = %d/%d. ", Hop_ManPiNum(p), Hop_ManPoNum(p) );
    printf( "A = %7d. ",       Hop_ManAndNum(p) );
    printf( "X = %5d. ",       Hop_ManExorNum(p) );
    printf( "Cre = %7d. ",     p->nCreated );
    printf( "Del = %7d. ",     p->nDeleted );
    printf( "Lev = %3d. ",     Hop_ManCountLevels(p) );
    printf( "\n" );
}